

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::begin_object
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,
          basic_json_visitor<wchar_t> *visitor,error_code *ec)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = this->level_;
  this->level_ = iVar1 + 1;
  if (this->max_nesting_depth_ <= iVar1) {
    bVar2 = std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                      (&this->err_handler_,max_nesting_depth_exceeded,&this->super_ser_context);
    this->more_ = bVar2;
    if (!bVar2) {
      std::error_code::operator=(ec,max_nesting_depth_exceeded);
      return;
    }
  }
  push_state(this,object);
  this->state_ = expect_member_name_or_end;
  (*visitor->_vptr_basic_json_visitor[3])(visitor,0,this,ec);
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  return;
}

Assistant:

void begin_object(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++level_ > max_nesting_depth_))
        {
            more_ = err_handler_(json_errc::max_nesting_depth_exceeded, *this);
            if (!more_)
            {
                ec = json_errc::max_nesting_depth_exceeded;
                return;
            }
        } 

        push_state(parse_state::object);
        state_ = parse_state::expect_member_name_or_end;
        visitor.begin_object(semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
    }